

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::FindProgram
                   (string *__return_storage_ptr__,string *name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  bool bVar1;
  pointer pbVar2;
  string *p;
  pointer pbVar3;
  allocator local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  string tryPath;
  
  tryPath._M_dataplus._M_p = (pointer)&tryPath.field_2;
  tryPath._M_string_length = 0;
  tryPath.field_2._M_local_buf[0] = '\0';
  bVar1 = FileExists(name,true);
  if (bVar1) {
    CollapseFullPath(__return_storage_ptr__,name);
  }
  else {
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (!no_system_path) {
      GetPath(&path,(char *)0x0);
    }
    for (pbVar2 = (userPaths->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = path.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        pbVar2 != (userPaths->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&path,pbVar2);
    }
    for (; pbVar3 != path.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      if ((pbVar3->_M_string_length == 0) ||
         ((pbVar3->_M_dataplus)._M_p[pbVar3->_M_string_length - 1] != '/')) {
        std::__cxx11::string::append((char *)pbVar3);
      }
    }
    pbVar2 = path.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar2 == path.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_69);
        goto LAB_0010ee7d;
      }
      std::__cxx11::string::_M_assign((string *)&tryPath);
      std::__cxx11::string::append((string *)&tryPath);
      bVar1 = FileExists(&tryPath,true);
      pbVar2 = pbVar2 + 1;
    } while (!bVar1);
    CollapseFullPath(__return_storage_ptr__,&tryPath);
LAB_0010ee7d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&path);
  }
  std::__cxx11::string::~string((string *)&tryPath);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::FindProgram(
  const std::string& name,
  const std::vector<std::string>& userPaths,
  bool no_system_path)
{
  std::string tryPath;

#if defined (_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)
  std::vector<std::string> extensions;
  // check to see if the name already has a .xxx at
  // the end of it
  // on windows try .com then .exe
  if(name.size() <= 3 || name[name.size()-4] != '.')
    {
    extensions.push_back(".com");
    extensions.push_back(".exe");

    // first try with extensions if the os supports them
    for(std::vector<std::string>::iterator i =
          extensions.begin(); i != extensions.end(); ++i)
      {
      tryPath = name;
      tryPath += *i;
      if(SystemTools::FileExists(tryPath, true))
        {
        return SystemTools::CollapseFullPath(tryPath);
        }
      }
    }
#endif

  // now try just the name
  if(SystemTools::FileExists(name, true))
    {
    return SystemTools::CollapseFullPath(name);
    }
  // now construct the path
  std::vector<std::string> path;
  // Add the system search path to our path.
  if (!no_system_path)
    {
    SystemTools::GetPath(path);
    }
  // now add the additional paths
  {
  for(std::vector<std::string>::const_iterator i =
        userPaths.begin();  i != userPaths.end(); ++i)
    {
    path.push_back(*i);
    }
  }
  // Add a trailing slash to all paths to aid the search process.
  {
  for(std::vector<std::string>::iterator i = path.begin();
      i != path.end(); ++i)
    {
    std::string& p = *i;
    if(p.empty() || *p.rbegin() != '/')
      {
      p += "/";
      }
    }
  }
  // Try each path
  for(std::vector<std::string>::iterator p = path.begin();
      p != path.end(); ++p)
    {
#ifdef _WIN32
    // Remove double quotes from the path on windows
    SystemTools::ReplaceString(*p, "\"", "");
#endif
#if defined (_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)
    // first try with extensions
    for(std::vector<std::string>::iterator ext
          = extensions.begin(); ext != extensions.end(); ++ext)
      {
      tryPath = *p;
      tryPath += name;
      tryPath += *ext;
      if(SystemTools::FileExists(tryPath, true))
        {
        return SystemTools::CollapseFullPath(tryPath);
        }
      }
#endif
    // now try it without them
    tryPath = *p;
    tryPath += name;
    if(SystemTools::FileExists(tryPath, true))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
    }
  // Couldn't find the program.
  return "";
}